

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

int mz_deflate(mz_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  mz_ulong mVar3;
  tdefl_status tVar4;
  mz_ulong mVar5;
  char cVar6;
  int iVar7;
  tdefl_flush flush_00;
  mz_ulong mVar8;
  uint uVar9;
  size_t out_bytes;
  size_t in_bytes;
  ulong local_48;
  ulong local_40;
  mz_ulong local_38;
  
  iVar7 = -2;
  if ((((pStream != (mz_streamp)0x0) &&
       ((uint)flush < 5 && pStream->state != (mz_internal_state *)0x0)) &&
      (pStream->next_out != (uchar *)0x0)) && (iVar7 = -5, pStream->avail_out != 0)) {
    flush_00 = TDEFL_SYNC_FLUSH;
    if (flush != 1) {
      flush_00 = flush;
    }
    if (*(int *)(pStream->state + 0x84) == 1) {
      iVar7 = -5;
      if (flush_00 == TDEFL_FINISH) {
        iVar7 = 1;
      }
    }
    else {
      local_38 = pStream->total_in;
      mVar3 = pStream->total_out;
      iVar7 = 0;
      do {
        local_40 = (ulong)pStream->avail_in;
        local_48 = (ulong)pStream->avail_out;
        tVar4 = tdefl_compress((tdefl_compressor *)pStream->state,pStream->next_in,&local_40,
                               pStream->next_out,&local_48,flush_00);
        uVar9 = (uint)local_40;
        pStream->next_in = pStream->next_in + (local_40 & 0xffffffff);
        uVar1 = pStream->avail_in;
        uVar2 = pStream->avail_out;
        pStream->avail_in = uVar1 - uVar9;
        mVar5 = (local_40 & 0xffffffff) + pStream->total_in;
        pStream->total_in = mVar5;
        pStream->adler = (ulong)*(uint *)(pStream->state + 0x20);
        pStream->next_out = pStream->next_out + (local_48 & 0xffffffff);
        pStream->avail_out = uVar2 - (uint)local_48;
        mVar8 = (local_48 & 0xffffffff) + pStream->total_out;
        pStream->total_out = mVar8;
        cVar6 = '\x02';
        if (tVar4 < TDEFL_STATUS_OKAY) {
          iVar7 = -2;
        }
        else if (tVar4 == TDEFL_STATUS_DONE) {
          iVar7 = 1;
        }
        else if (uVar2 != (uint)local_48) {
          cVar6 = (uVar1 == uVar9) * '\x02';
          if (flush_00 == TDEFL_FINISH) {
            cVar6 = '\0';
          }
          if (uVar1 == uVar9 && flush_00 == TDEFL_NO_FLUSH) {
            cVar6 = (mVar8 != mVar3 || mVar5 != local_38) + '\x01';
          }
        }
      } while (cVar6 == '\0');
      if (cVar6 != '\x02') {
        iVar7 = -5;
      }
    }
  }
  return iVar7;
}

Assistant:

int mz_deflate(mz_streamp pStream, int flush) {
  size_t in_bytes, out_bytes;
  mz_ulong orig_total_in, orig_total_out;
  int mz_status = MZ_OK;

  if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > MZ_FINISH) ||
      (!pStream->next_out))
    return MZ_STREAM_ERROR;
  if (!pStream->avail_out)
    return MZ_BUF_ERROR;

  if (flush == MZ_PARTIAL_FLUSH)
    flush = MZ_SYNC_FLUSH;

  if (((tdefl_compressor *)pStream->state)->m_prev_return_status ==
      TDEFL_STATUS_DONE)
    return (flush == MZ_FINISH) ? MZ_STREAM_END : MZ_BUF_ERROR;

  orig_total_in = pStream->total_in;
  orig_total_out = pStream->total_out;
  for (;;) {
    tdefl_status defl_status;
    in_bytes = pStream->avail_in;
    out_bytes = pStream->avail_out;

    defl_status = tdefl_compress((tdefl_compressor *)pStream->state,
                                 pStream->next_in, &in_bytes, pStream->next_out,
                                 &out_bytes, (tdefl_flush)flush);
    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tdefl_get_adler32((tdefl_compressor *)pStream->state);

    pStream->next_out += (mz_uint)out_bytes;
    pStream->avail_out -= (mz_uint)out_bytes;
    pStream->total_out += (mz_uint)out_bytes;

    if (defl_status < 0) {
      mz_status = MZ_STREAM_ERROR;
      break;
    } else if (defl_status == TDEFL_STATUS_DONE) {
      mz_status = MZ_STREAM_END;
      break;
    } else if (!pStream->avail_out)
      break;
    else if ((!pStream->avail_in) && (flush != MZ_FINISH)) {
      if ((flush) || (pStream->total_in != orig_total_in) ||
          (pStream->total_out != orig_total_out))
        break;
      return MZ_BUF_ERROR; /* Can't make forward progress without some input.
                            */
    }
  }
  return mz_status;
}